

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mxnet2ncnn.cpp
# Opt level: O0

bool __thiscall MXNetNode::is_weight(MXNetNode *this)

{
  __type _Var1;
  size_type sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  MXNetParam *p;
  int i;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar3;
  int iVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  
  iVar3 = 0;
  __lhs = in_RDI;
  while( true ) {
    iVar4 = iVar3;
    sVar2 = std::vector<MXNetParam,_std::allocator<MXNetParam>_>::size
                      ((vector<MXNetParam,_std::allocator<MXNetParam>_> *)in_RDI->_M_string_length);
    if ((int)sVar2 <= iVar3) {
      return false;
    }
    std::vector<MXNetParam,_std::allocator<MXNetParam>_>::operator[]
              ((vector<MXNetParam,_std::allocator<MXNetParam>_> *)in_RDI->_M_string_length,
               (long)iVar4);
    _Var1 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(iVar4,in_stack_ffffffffffffffe8));
    if (_Var1) break;
    iVar3 = iVar4 + 1;
  }
  return true;
}

Assistant:

bool MXNetNode::is_weight() const
{
    for (int i=0; i<(int)(*params).size(); i++)
    {
        const MXNetParam& p = (*params)[i];
        if (p.name == name)
            return true;
    }

    return false;
}